

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

int Of_CutMergeOrderMux(Of_Cut_t *pCut0,Of_Cut_t *pCut1,Of_Cut_t *pCut2,Of_Cut_t *pCut,int nLutSize)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int local_94;
  int local_90;
  int local_8c;
  int *pC;
  int c;
  int xMin;
  int *pC2;
  uint local_68;
  int nSize2;
  int i2;
  int x2;
  int *pC1;
  uint local_50;
  int nSize1;
  int i1;
  int x1;
  int *pC0;
  int nSize0;
  int i0;
  int x0;
  int nLutSize_local;
  Of_Cut_t *pCut_local;
  Of_Cut_t *pCut2_local;
  Of_Cut_t *pCut1_local;
  Of_Cut_t *pCut0_local;
  
  pC0._4_4_ = 0;
  uVar1 = *(uint *)&pCut0->field_0x10;
  local_50 = 0;
  uVar2 = *(uint *)&pCut1->field_0x10;
  local_68 = 0;
  uVar3 = *(uint *)&pCut2->field_0x10;
  pC._0_4_ = 0;
  while( true ) {
    if (pC0._4_4_ == uVar1 >> 0x1b) {
      local_8c = 1000000000;
    }
    else {
      local_8c = pCut0->pLeaves[(int)pC0._4_4_];
    }
    if (local_50 == uVar2 >> 0x1b) {
      local_90 = 1000000000;
    }
    else {
      local_90 = pCut1->pLeaves[(int)local_50];
    }
    if (local_68 == uVar3 >> 0x1b) {
      local_94 = 1000000000;
    }
    else {
      local_94 = pCut2->pLeaves[(int)local_68];
    }
    iVar4 = Abc_MinInt(local_8c,local_90);
    iVar4 = Abc_MinInt(iVar4,local_94);
    if (iVar4 == 1000000000) break;
    if ((int)pC == nLutSize) {
      return 0;
    }
    iVar5 = (int)pC + 1;
    pCut->pLeaves[(int)pC] = iVar4;
    if (local_8c == iVar4) {
      pC0._4_4_ = pC0._4_4_ + 1;
    }
    if (local_90 == iVar4) {
      local_50 = local_50 + 1;
    }
    pC._0_4_ = iVar5;
    if (local_94 == iVar4) {
      local_68 = local_68 + 1;
    }
  }
  *(uint *)&pCut->field_0x10 = *(uint *)&pCut->field_0x10 & 0x7ffffff | (int)pC << 0x1b;
  *(uint *)&pCut->field_0x10 = *(uint *)&pCut->field_0x10 & 0xf8000000 | 0x7ffffff;
  pCut->Sign = pCut0->Sign | pCut1->Sign | pCut2->Sign;
  return 1;
}

Assistant:

static inline int Of_CutMergeOrderMux( Of_Cut_t * pCut0, Of_Cut_t * pCut1, Of_Cut_t * pCut2, Of_Cut_t * pCut, int nLutSize )
{ 
    int x0, i0 = 0, nSize0 = pCut0->nLeaves, * pC0 = pCut0->pLeaves;
    int x1, i1 = 0, nSize1 = pCut1->nLeaves, * pC1 = pCut1->pLeaves;
    int x2, i2 = 0, nSize2 = pCut2->nLeaves, * pC2 = pCut2->pLeaves;
    int xMin, c = 0, * pC  = pCut->pLeaves;
    while ( 1 )
    {
        x0 = (i0 == nSize0) ? ABC_INFINITY : pC0[i0];
        x1 = (i1 == nSize1) ? ABC_INFINITY : pC1[i1];
        x2 = (i2 == nSize2) ? ABC_INFINITY : pC2[i2];
        xMin = Abc_MinInt( Abc_MinInt(x0, x1), x2 );
        if ( xMin == ABC_INFINITY ) break;
        if ( c == nLutSize ) return 0;
        pC[c++] = xMin;
        if (x0 == xMin) i0++;
        if (x1 == xMin) i1++;
        if (x2 == xMin) i2++;
    }
    pCut->nLeaves = c;
    pCut->iFunc = OF_NO_FUNC;
    pCut->Sign = pCut0->Sign | pCut1->Sign | pCut2->Sign;
    return 1;
}